

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O1

xcore_reg XCore_reg_id(char *name)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0x18;
  do {
    iVar1 = strcmp(name,*(char **)((long)&reg_name_maps[0].id + lVar2));
    if (iVar1 == 0) {
      return *(xcore_reg *)((long)&group_name_maps[6].name + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1a8);
  return XCORE_REG_INVALID;
}

Assistant:

xcore_reg XCore_reg_id(char *name)
{
	int i;

	for(i = 1; i < ARR_SIZE(reg_name_maps); i++) {
		if (!strcmp(name, reg_name_maps[i].name))
			return reg_name_maps[i].id;
	}

	// not found
	return 0;
}